

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

string * __thiscall
rcg::Device::getUserDefinedName_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  PIFGetDeviceInfo p_Var1;
  GC_ERROR GVar2;
  void *pvVar3;
  DEVICE_INFO_CMD in_R8D;
  size_t *psVar4;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  INFO_DATATYPE type;
  size_t tmp_size;
  string local_b8;
  char tmp [100];
  
  std::mutex::lock(&this->mtx);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  type = 0;
  tmp[0x50] = '\0';
  tmp[0x51] = '\0';
  tmp[0x52] = '\0';
  tmp[0x53] = '\0';
  tmp[0x54] = '\0';
  tmp[0x55] = '\0';
  tmp[0x56] = '\0';
  tmp[0x57] = '\0';
  tmp[0x58] = '\0';
  tmp[0x59] = '\0';
  tmp[0x5a] = '\0';
  tmp[0x5b] = '\0';
  tmp[0x5c] = '\0';
  tmp[0x5d] = '\0';
  tmp[0x5e] = '\0';
  tmp[0x5f] = '\0';
  tmp[0x40] = '\0';
  tmp[0x41] = '\0';
  tmp[0x42] = '\0';
  tmp[0x43] = '\0';
  tmp[0x44] = '\0';
  tmp[0x45] = '\0';
  tmp[0x46] = '\0';
  tmp[0x47] = '\0';
  tmp[0x48] = '\0';
  tmp[0x49] = '\0';
  tmp[0x4a] = '\0';
  tmp[0x4b] = '\0';
  tmp[0x4c] = '\0';
  tmp[0x4d] = '\0';
  tmp[0x4e] = '\0';
  tmp[0x4f] = '\0';
  tmp[0x30] = '\0';
  tmp[0x31] = '\0';
  tmp[0x32] = '\0';
  tmp[0x33] = '\0';
  tmp[0x34] = '\0';
  tmp[0x35] = '\0';
  tmp[0x36] = '\0';
  tmp[0x37] = '\0';
  tmp[0x38] = '\0';
  tmp[0x39] = '\0';
  tmp[0x3a] = '\0';
  tmp[0x3b] = '\0';
  tmp[0x3c] = '\0';
  tmp[0x3d] = '\0';
  tmp[0x3e] = '\0';
  tmp[0x3f] = '\0';
  tmp[0x20] = '\0';
  tmp[0x21] = '\0';
  tmp[0x22] = '\0';
  tmp[0x23] = '\0';
  tmp[0x24] = '\0';
  tmp[0x25] = '\0';
  tmp[0x26] = '\0';
  tmp[0x27] = '\0';
  tmp[0x28] = '\0';
  tmp[0x29] = '\0';
  tmp[0x2a] = '\0';
  tmp[0x2b] = '\0';
  tmp[0x2c] = '\0';
  tmp[0x2d] = '\0';
  tmp[0x2e] = '\0';
  tmp[0x2f] = '\0';
  tmp[0x10] = '\0';
  tmp[0x11] = '\0';
  tmp[0x12] = '\0';
  tmp[0x13] = '\0';
  tmp[0x14] = '\0';
  tmp[0x15] = '\0';
  tmp[0x16] = '\0';
  tmp[0x17] = '\0';
  tmp[0x18] = '\0';
  tmp[0x19] = '\0';
  tmp[0x1a] = '\0';
  tmp[0x1b] = '\0';
  tmp[0x1c] = '\0';
  tmp[0x1d] = '\0';
  tmp[0x1e] = '\0';
  tmp[0x1f] = '\0';
  tmp[0x60] = '\0';
  tmp[0x61] = '\0';
  tmp[0x62] = '\0';
  tmp[99] = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[10] = '\0';
  tmp[0xb] = '\0';
  tmp[0xc] = '\0';
  tmp[0xd] = '\0';
  tmp[0xe] = '\0';
  tmp[0xf] = '\0';
  tmp_size = 100;
  if (this->dev == (DEV_HANDLE)0x0) {
    std::__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
               &(this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>);
    pvVar3 = Interface::getHandle((Interface *)local_b8._M_dataplus._M_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
    if (pvVar3 == (void *)0x0) {
      GVar2 = -0x3e9;
    }
    else {
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFGetDeviceInfo;
      std::__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
                 &(this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>);
      pvVar3 = Interface::getHandle((Interface *)local_b8._M_dataplus._M_p);
      pcVar5 = tmp;
      GVar2 = (*p_Var1)(pvVar3,(this->id)._M_dataplus._M_p,6,&type,pcVar5,&tmp_size);
      in_R8D = (DEVICE_INFO_CMD)pcVar5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
    }
  }
  else {
    psVar4 = &tmp_size;
    GVar2 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetInfo)(this->dev,6,&type,tmp,psVar4);
    in_R8D = (DEVICE_INFO_CMD)psVar4;
  }
  if ((GVar2 == 0) && (type == 1)) {
    for (uVar6 = 0; (uVar6 < tmp_size && (tmp[uVar6] != '\0')); uVar6 = uVar6 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
               (shared_ptr<const_rcg::GenTLWrapper> *)0x4,in_R8D);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getUserDefinedName()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  // try to get user defined name

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[100]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (getHandle() != 0)
  {
    err=gentl->DevGetInfo(getHandle(), GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp,
      &tmp_size);
  }
  else if (getParent()->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), getID().c_str(),
      GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }
  else
  {
    // since user defined name is optional, fall back to display name in case
    // of an error

    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}